

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natwm.c
# Opt level: O0

void * wm_event_loop(void *passed_state)

{
  logger *log;
  int iVar1;
  natwm_error nVar2;
  undefined8 uVar3;
  uint8_t type;
  uint8_t rtype;
  natwm_error err;
  int num;
  fd_set *__arr;
  undefined1 auStack_c0 [4];
  uint __i;
  timespec timeout;
  undefined1 local_a8 [4];
  int xcb_fd;
  fd_set fds;
  xcb_generic_event_t *event;
  natwm_state *state;
  void *passed_state_local;
  
  fds.__fds_bits[0xf] = 0;
  if (passed_state == (void *)0x0) {
    internal_logger(natwm_logger,LEVEL_ERROR,"Received invalid passed state to event loop");
    passed_state_local = (void *)0xffffffffffffffff;
  }
  else {
    timeout.tv_nsec._4_4_ = xcb_get_file_descriptor(*(undefined8 *)((long)passed_state + 8));
    _auStack_c0 = 0;
    timeout.tv_sec = 25000000;
    while (status == 0) {
      for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
        *(undefined8 *)(local_a8 + (ulong)__arr._4_4_ * 8) = 0;
      }
      *(ulong *)(local_a8 + (long)(timeout.tv_nsec._4_4_ / 0x40) * 8) =
           1L << ((byte)((long)timeout.tv_nsec._4_4_ % 0x40) & 0x3f) |
           *(ulong *)(local_a8 + (long)(timeout.tv_nsec._4_4_ / 0x40) * 8);
      iVar1 = xcb_connection_has_error
                        (*(undefined8 *)((long)passed_state + 8),0x40,
                         (long)timeout.tv_nsec._4_4_ % 0x40 & 0xffffffff);
      if ((iVar1 != 0) && (status == 0)) {
        internal_logger(natwm_logger,LEVEL_ERROR,"Connection to X server closed");
        status = -1;
        return (void *)0xffffffffffffffff;
      }
      iVar1 = pselect(timeout.tv_nsec._4_4_ + 1,(fd_set *)local_a8,(fd_set *)0x0,(fd_set *)0x0,
                      (timespec *)auStack_c0,(__sigset_t *)0x0);
      if (iVar1 != 0) {
        if (iVar1 < 0) {
          internal_logger(natwm_logger,LEVEL_ERROR,"pselect failed");
          status = -1;
          return (void *)0xffffffffffffffff;
        }
        while( true ) {
          fds.__fds_bits[0xf] = xcb_poll_for_event(*(undefined8 *)((long)passed_state + 8));
          if ((xcb_generic_event_t *)fds.__fds_bits[0xf] == (xcb_generic_event_t *)0x0) break;
          nVar2 = event_handle((natwm_state *)passed_state,
                               (xcb_generic_event_t *)fds.__fds_bits[0xf]);
          log = natwm_logger;
          if (nVar2 == NOT_FOUND_ERROR) {
            free((void *)fds.__fds_bits[0xf]);
          }
          else if (nVar2 == NO_ERROR) {
            free((void *)fds.__fds_bits[0xf]);
            xcb_flush(*(undefined8 *)((long)passed_state + 8));
          }
          else {
            uVar3 = xcb_event_get_label(*(byte *)fds.__fds_bits[0xf] & 0x7f);
            internal_logger(log,LEVEL_WARNING,"Failed to perform %s",uVar3);
            free((void *)fds.__fds_bits[0xf]);
          }
        }
      }
    }
    internal_logger(natwm_logger,LEVEL_INFO,"Disconnected...");
    passed_state_local = (void *)0x0;
  }
  return passed_state_local;
}

Assistant:

static void *wm_event_loop(void *passed_state)
{
        struct natwm_state *state = (struct natwm_state *)passed_state;
        xcb_generic_event_t *event = XCB_NONE;

        if (state == NULL) {
                LOG_ERROR(natwm_logger, "Received invalid passed state to event loop");

                return (intptr_t *)-1;
        }

        fd_set fds;
        int xcb_fd = xcb_get_file_descriptor(state->xcb);

        // If there hasn't been an X event in 25 milliseconds then we timeout
        // and check for any interuptions or errors
        struct timespec timeout = {
                .tv_sec = 0,
                .tv_nsec = 25000000, // 25 Milliseconds
        };

        while (status == RUNNING) {
                FD_ZERO(&fds);
                FD_SET(xcb_fd, &fds);

                if (xcb_connection_has_error(state->xcb) && status == RUNNING) {
                        LOG_ERROR(natwm_logger, "Connection to X server closed");

                        goto handle_error;
                }

                int num = pselect(xcb_fd + 1, &fds, NULL, NULL, &timeout, NULL);

                if (num == 0) {
                        // No events to process
                        continue;
                }

                if (num < 0) {
                        LOG_ERROR(natwm_logger, "pselect failed");

                        goto handle_error;
                }

                while ((event = xcb_poll_for_event(state->xcb))) {
                        enum natwm_error err = event_handle(state, event);

                        if (err == NOT_FOUND_ERROR) {
                                free(event);

                                continue;
                        }

                        if (err != NO_ERROR) {
                                uint8_t rtype = event->response_type;
                                uint8_t type = (uint8_t)(GET_EVENT_TYPE(rtype));

                                LOG_WARNING(natwm_logger,
                                            "Failed to perform %s",
                                            xcb_event_get_label(type));

                                free(event);

                                continue;
                        }

                        free(event);

                        xcb_flush(state->xcb);
                }
        }

        // Event loop stopped disconnect from x
        LOG_INFO(natwm_logger, "Disconnected...");

        return (intptr_t *)0;

handle_error:
        status = STOPPED;

        return (intptr_t *)-1;
}